

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleMainExtended.cpp
# Opt level: O2

int main(int argvs,char **argv)

{
  bool bVar1;
  argvParser *this;
  argParserAdvancedConfiguration *paVar2;
  ostream *poVar3;
  allocator local_4ac;
  allocator local_4ab;
  allocator local_4aa;
  allocator local_4a9;
  function<int_(int,_char_**)> lambdaCallback;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  function<int_(int,_char_**)> local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  this = (argvParser *)operator_new(0x130);
  std::__cxx11::string::string((string *)&local_88,"Extendend Example",(allocator *)&lambdaCallback)
  ;
  std::__cxx11::string::string
            ((string *)&local_a8,"This application intends to be an example ",&local_4ac);
  std::__cxx11::string::string((string *)&local_c8,"",&local_4ab);
  argvParser::argvParser(this,&local_88,&local_a8,true,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_e8,"-t",(allocator *)&lambdaCallback);
  std::__cxx11::string::string((string *)&local_108,"--test",&local_4ac);
  std::__cxx11::string::string((string *)&local_128,"test argument",&local_4ab);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:50:48)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:50:48)>
             ::_M_manager;
  paVar2 = argvParser::addArg(this,&local_e8,&local_108,&local_128,(function<void_()> *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_148,
             "It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"
             ,&local_4aa);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  lambdaCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  lambdaCallback.super__Function_base._M_functor._8_8_ = 0;
  lambdaCallback._M_invoker =
       std::
       _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:53:50)>
       ::_M_invoke;
  lambdaCallback.super__Function_base._M_manager =
       std::
       _Function_handler<int_(int,_char_**),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:53:50)>
       ::_M_manager;
  std::__cxx11::string::string((string *)&local_168,"-f",&local_4ac);
  std::__cxx11::string::string((string *)&local_188,"--foo",&local_4ab);
  std::__cxx11::string::string
            ((string *)&local_1a8,"foo test argument  required argument example",&local_4aa);
  std::function<int_(int,_char_**)>::function(&local_1c8,&lambdaCallback);
  paVar2 = argvParser::addArg(this,&local_168,&local_188,&local_1a8,&local_1c8);
  paVar2 = argParserAdvancedConfiguration::required(paVar2);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  std::__cxx11::string::string((string *)&local_1e8,"prints the next element to the cli",&local_4a9)
  ;
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::_Function_base::~_Function_base(&local_1c8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string((string *)&local_208,"-p",&local_4ac);
  std::__cxx11::string::string((string *)&local_228,"--print",&local_4ab);
  std::__cxx11::string::string((string *)&local_248,"echo text",&local_4aa);
  paVar2 = argvParser::addArg(this,&local_208,&local_228,&local_248,printCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  std::__cxx11::string::string((string *)&local_268,"echo the next argument",&local_4a9);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::string((string *)&local_288,"-e",&local_4ac);
  std::__cxx11::string::string((string *)&local_2a8,"--enums",&local_4ab);
  std::__cxx11::string::string((string *)&local_2c8,"enum example",&local_4aa);
  paVar2 = argvParser::addArg(this,&local_288,&local_2a8,&local_2c8,enumCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  paVar2 = argParserAdvancedConfiguration::allowedParameter(paVar2,3,"abc","def","xyz");
  std::__cxx11::string::string
            ((string *)&local_2e8,"here is just a pre defined set of arguments allowed",&local_4a9);
  argParserAdvancedConfiguration::addAdditionalHelp(paVar2,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string((string *)&local_308,"-o",&local_4ac);
  std::__cxx11::string::string((string *)&local_328,"--open",&local_4ab);
  std::__cxx11::string::string((string *)&local_348,"example to complete a file/dir",&local_4aa);
  paVar2 = argvParser::addArg(this,&local_308,&local_328,&local_348,printCallBack);
  paVar2 = argParserAdvancedConfiguration::numberOfParameter(paVar2,1);
  argParserAdvancedConfiguration::asFile(paVar2);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string((string *)&local_368,"-nh",&local_4ac);
  std::__cxx11::string::string((string *)&local_388,"--noHighlight",&local_4ab);
  std::__cxx11::string::string((string *)&local_3a8,"disabledCli highlighting",&local_4aa);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:70:67)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/diridari[P]CPP-Argument-Parser/exampleMainExtended.cpp:70:67)>
             ::_M_manager;
  argvParser::addArg(this,&local_368,&local_388,&local_3a8,(function<void_()> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::string((string *)&local_3c8,"logging",&local_4ac);
  argvParser::addSection(this,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::string((string *)&local_3e8,"-l",&local_4ac);
  std::__cxx11::string::string((string *)&local_408,"--logging",&local_4ab);
  std::__cxx11::string::string((string *)&local_428,"enable logging",&local_4aa);
  argvParser::addArg(this,&local_3e8,&local_408,&local_428,loggingCallBack);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::string((string *)&local_448,"-logf",&local_4ac);
  std::__cxx11::string::string((string *)&local_468,"--logFile",&local_4ab);
  std::__cxx11::string::string((string *)&local_488,"generate logfile",&local_4aa);
  argvParser::addArg(this,&local_448,&local_468,&local_488,logFileCallBack);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  bVar1 = argvParser::analyseArgv(this,argvs,argv);
  if (!bVar1) {
    argvParser::printHelpMessage(this,(bool)(disableCliH ^ 1));
    bVar1 = argvParser::foundAllRequierdArgs(this);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::_Function_base::~_Function_base(&lambdaCallback.super__Function_base);
  return 0;
}

Assistant:

int main(int argvs, char **argv) {
    // define program description
    argvParser *p = new argvParser("Extendend Example","This application intends to be an example ");
    // define program arguments
    // Simple Lambda CallBack
    p->addArg("-t", "--test", "test argument", []() { cout << "got \"test\"" << endl; })
    ->addAdditionalHelp("It is possible to add addition information for one command. Now the user can ype <-h -t> and see this additional information"); // no further arguments used);
    // Lambda CallBack as required and one additional parameter
    function<int(int, char **)> lambdaCallback = [](int index, char **buff) {
        index++;
        cout << "got \"foo\" with : " << buff[index] << endl;
        return index;
    };
    p->addArg("-f", "--foo", "foo test argument  required argument example",
              lambdaCallback)->required()->numberOfParameter(1)->addAdditionalHelp("prints the next element to the cli");
    // Function as Callback
    p->addArg("-p", "--print", "echo text", printCallBack)->numberOfParameter(1)->addAdditionalHelp(
            "echo the next argument");
    // pre defined parameter for "-e"  with bash autocompletion
    p->addArg("-e", "--enums", "enum example", enumCallBack)->numberOfParameter(1)->allowedParameter(3, "abc", "def",
                                                                                                     "xyz")
            ->addAdditionalHelp("here is just a pre defined set of arguments allowed");
    // autocompletion with filenames
    p->addArg("-o", "--open", "example to complete a file/dir", printCallBack)->numberOfParameter(1)->asFile();
    // lambda
    p->addArg("-nh", "--noHighlight", "disabledCli highlighting", [] { disableCliH = false; });
    p->addSection("logging");
    p->addArg("-l", "--logging", "enable logging", loggingCallBack);
    p->addArg("-logf", "--logFile", "generate logfile", logFileCallBack);

    // check if all arguments are valid
    if (!p->analyseArgv(argvs, argv)) {
        p->printHelpMessage(!disableCliH);
        // check if all required arguments have been parsed
        if (!p->foundAllRequierdArgs()) {
            cout
                    << "you have not entered at least one required argument  \n\t -f has been marked as an required argument try it with -f"
                    << endl;
        }
    }

    return 0;
}